

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_value<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  allocator<char> *__a;
  spec *psVar2;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  context<toml::type_config> *in_stack_00000030;
  location *in_stack_00000038;
  context<toml::type_config> *in_stack_00000210;
  location *in_stack_00000218;
  source_location src_1;
  source_location src;
  result<toml::value_t,_toml::error_info> ty_res;
  context<toml::type_config> *in_stack_000008f0;
  location *in_stack_000008f8;
  context<toml::type_config> *in_stack_00000990;
  location *in_stack_00000998;
  context<toml::type_config> *in_stack_000009d0;
  location *in_stack_000009d8;
  context<toml::type_config> *in_stack_00000bd0;
  location *in_stack_00000bd8;
  context<toml::type_config> *in_stack_00001060;
  location *in_stack_00001068;
  source_location *in_stack_fffffffffffffa08;
  allocator<char> *f;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffa10;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this;
  char *in_stack_fffffffffffffa48;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  allocator<char> local_599;
  result<toml::value_t,_toml::error_info> *in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  allocator<char> local_4f9 [121];
  allocator<char> local_480 [72];
  string *in_stack_fffffffffffffbc8;
  source_location *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  allocator<char> local_341 [160];
  allocator<char> local_2a1 [113];
  context<toml::type_config> *in_stack_fffffffffffffdd0;
  location *in_stack_fffffffffffffdd8;
  context<toml::type_config> *in_stack_fffffffffffffde0;
  location *in_stack_fffffffffffffde8;
  context<toml::type_config> *in_stack_fffffffffffffe10;
  location *in_stack_fffffffffffffe18;
  context<toml::type_config> *in_stack_fffffffffffffe90;
  location *in_stack_fffffffffffffe98;
  context<toml::type_config> *in_stack_fffffffffffffeb0;
  location *in_stack_fffffffffffffeb8;
  result<toml::value_t,_toml::error_info> local_78;
  context<toml::type_config> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  guess_value_type<toml::type_config>(in_stack_000008f8,in_stack_000008f0);
  bVar1 = result<toml::value_t,_toml::error_info>::is_err(&local_78);
  if (bVar1) {
    result<toml::value_t,_toml::error_info>::unwrap_err
              (in_stack_fffffffffffffa68,(source_location)in_stack_fffffffffffffa70);
    err<toml::error_info_const&>((error_info *)in_stack_fffffffffffffa68);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffa10,(failure_type *)in_stack_fffffffffffffa08);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7212ef);
  }
  else {
    __a = (allocator<char> *)
          result<toml::value_t,_toml::error_info>::unwrap
                    (in_stack_fffffffffffffa68,(source_location)in_stack_fffffffffffffa70);
    switch(*__a) {
    case (allocator<char>)0x0:
      psVar2 = context<toml::type_config>::toml_spec(local_18);
      if ((psVar2->ext_null_value & 1U) == 0) {
        region::region((region *)in_stack_fffffffffffffa80,(location *)in_stack_fffffffffffffa78);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffffa90,(region *)in_stack_fffffffffffffa88)
        ;
        region::~region((region *)in_stack_fffffffffffffa10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   in_stack_fffffffffffffa48,__a);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   in_stack_fffffffffffffa48,__a);
        make_error_info<>(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                          in_stack_fffffffffffffbc8);
        err<toml::error_info>((error_info *)in_stack_fffffffffffffa68);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffffa10,(failure_type *)in_stack_fffffffffffffa08);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7214dd);
        error_info::~error_info((error_info *)in_stack_fffffffffffffa10);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa10);
        std::allocator<char>::~allocator(local_341);
        source_location::~source_location((source_location *)in_stack_fffffffffffffa10);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa10);
        std::allocator<char>::~allocator(local_2a1);
        source_location::~source_location((source_location *)in_stack_fffffffffffffa10);
      }
      else {
        parse_null<toml::type_config>(in_stack_00000038,in_stack_00000030);
      }
      break;
    case (allocator<char>)0x1:
      parse_boolean<toml::type_config>(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      break;
    case (allocator<char>)0x2:
      parse_integer<toml::type_config>(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      break;
    case (allocator<char>)0x3:
      parse_floating<toml::type_config>(in_stack_000009d8,in_stack_000009d0);
      break;
    case (allocator<char>)0x4:
      parse_string<toml::type_config>(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      break;
    case (allocator<char>)0x5:
      parse_offset_datetime<toml::type_config>(in_stack_00000bd8,in_stack_00000bd0);
      break;
    case (allocator<char>)0x6:
      parse_local_datetime<toml::type_config>(in_stack_00000218,in_stack_00000210);
      break;
    case (allocator<char>)0x7:
      parse_local_date<toml::type_config>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      break;
    case (allocator<char>)0x8:
      parse_local_time<toml::type_config>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      break;
    case (allocator<char>)0x9:
      parse_array<toml::type_config>(in_stack_00000998,in_stack_00000990);
      break;
    case (allocator<char>)0xa:
      parse_inline_table<toml::type_config>(in_stack_00001068,in_stack_00001060);
      break;
    default:
      region::region((region *)in_stack_fffffffffffffa80,(location *)in_stack_fffffffffffffa78);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffffa90,(region *)in_stack_fffffffffffffa88);
      region::~region((region *)in_stack_fffffffffffffa10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_fffffffffffffa48,__a);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      this = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)&local_599;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_fffffffffffffa48,__a);
      make_error_info<>(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                        in_stack_fffffffffffffbc8);
      f = local_4f9 + 0x79;
      err<toml::error_info>((error_info *)in_stack_fffffffffffffa68);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result(this,(failure_type *)f)
      ;
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7218ea);
      error_info::~error_info((error_info *)this);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::allocator<char>::~allocator(&local_599);
      source_location::~source_location((source_location *)this);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::allocator<char>::~allocator(local_4f9);
      source_location::~source_location((source_location *)this);
    }
  }
  result<toml::value_t,_toml::error_info>::~result
            ((result<toml::value_t,_toml::error_info> *)0x721a3f);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_value(location& loc, context<TC>& ctx)
{
    const auto ty_res = guess_value_type(loc, ctx);
    if(ty_res.is_err())
    {
        return err(ty_res.unwrap_err());
    }

    switch(ty_res.unwrap())
    {
        case value_t::empty:
        {
            if(ctx.toml_spec().ext_null_value)
            {
                return parse_null(loc, ctx);
            }
            else
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_value: unknown value appeared",
                            std::move(src), "here"));
            }
        }
        case value_t::boolean        : {return parse_boolean        (loc, ctx);}
        case value_t::integer        : {return parse_integer        (loc, ctx);}
        case value_t::floating       : {return parse_floating       (loc, ctx);}
        case value_t::string         : {return parse_string         (loc, ctx);}
        case value_t::offset_datetime: {return parse_offset_datetime(loc, ctx);}
        case value_t::local_datetime : {return parse_local_datetime (loc, ctx);}
        case value_t::local_date     : {return parse_local_date     (loc, ctx);}
        case value_t::local_time     : {return parse_local_time     (loc, ctx);}
        case value_t::array          : {return parse_array          (loc, ctx);}
        case value_t::table          : {return parse_inline_table   (loc, ctx);}
        default:
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_value: unknown value appeared",
                        std::move(src), "here"));
        }
    }
}